

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compilation.cpp
# Opt level: O2

void __thiscall
pstore::repo::definition::definition
          (definition *this,digest d,extent<pstore::repo::fragment> x,
          typed_address<pstore::indirect_string> n,linkage l,visibility v)

{
  linkage lVar1;
  visibility vVar2;
  uint32_t uVar3;
  undefined7 in_register_00000081;
  undefined7 in_register_00000089;
  initializer_list<pstore::repo::linkage> __l;
  initializer_list<pstore::repo::visibility> __l_00;
  visibility local_1b [3];
  linkage local_18 [16];
  
  *(address *)&(this->digest).v_ = x.addr.a_.a_.a_;
  *(uint64_t *)((long)&(this->digest).v_ + 8) = x.size;
  (this->fext).addr.a_.a_ = (value_type)n.a_.a_;
  (this->fext).size = CONCAT71(in_register_00000081,l);
  (this->name).a_.a_ = CONCAT71(in_register_00000089,v);
  this->field_3 = (anon_union_1_3_530f19d7_for_definition_3)0x0;
  this->padding1 = '\0';
  this->padding2 = 0;
  this->padding3 = 0;
  local_18[0] = internal_no_symbol;
  local_18[1] = internal;
  local_18[2] = append;
  local_18[3] = common;
  local_18[4] = external;
  local_18[5] = link_once_any;
  local_18[6] = link_once_odr;
  local_18[7] = weak_any;
  local_18[8] = 8;
  __l._M_len = 9;
  __l._M_array = local_18;
  lVar1 = std::max<pstore::repo::linkage>(__l);
  uVar3 = round_to_power_of_2(lVar1 + 1);
  if (uVar3 != 0x10) {
    assert_failed("pstore::round_to_power_of_2 ( static_cast<typename std::underlying_type<Enum>::type> (std::max (init)) + 1U) == Bitfield::max () + 1U"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/mcrepo/compilation.cpp"
                  ,0x33);
  }
  local_1b[0] = default_vis;
  local_1b[1] = hidden_vis;
  local_1b[2] = 2;
  __l_00._M_len = 3;
  __l_00._M_array = local_1b;
  vVar2 = std::max<pstore::repo::visibility>(__l_00);
  uVar3 = round_to_power_of_2(vVar2 + 1);
  if (uVar3 == 4) {
    (this->field_3).bf = (d.v_._8_1_ & 3) << 4 | (byte)d.v_ & 0xf | (this->field_3).bf & 0xc0;
    return;
  }
  assert_failed("pstore::round_to_power_of_2 ( static_cast<typename std::underlying_type<Enum>::type> (std::max (init)) + 1U) == Bitfield::max () + 1U"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/mcrepo/compilation.cpp"
                ,0x33);
}

Assistant:

definition::definition (pstore::index::digest const d, pstore::extent<fragment> const x,
                        pstore::typed_address<pstore::indirect_string> const n,
                        enum linkage const l, enum visibility const v) noexcept
        : digest{d}
        , fext{x}
        , name{n} {

    PSTORE_STATIC_ASSERT (std::is_standard_layout<definition>::value);
    PSTORE_STATIC_ASSERT (alignof (definition) == 16);
    PSTORE_STATIC_ASSERT (sizeof (definition) == 48);
    PSTORE_STATIC_ASSERT (offsetof (definition, digest) == 0);
    PSTORE_STATIC_ASSERT (offsetof (definition, fext) == 16);
    PSTORE_STATIC_ASSERT (offsetof (definition, name) == 32);
    PSTORE_STATIC_ASSERT (offsetof (definition, bf) == 40);
    PSTORE_STATIC_ASSERT (offsetof (definition, padding1) == 41);
    PSTORE_STATIC_ASSERT (offsetof (definition, padding2) == 42);
    PSTORE_STATIC_ASSERT (offsetof (definition, padding3) == 44);

#define X(a) repo::linkage::a,
    assert_enum_field_width<enum linkage, decltype (linkage_)> ({PSTORE_REPO_LINKAGES});
#undef X
#define X(a) repo::visibility::a,
    assert_enum_field_width<enum visibility, decltype (visibility_)> ({PSTORE_REPO_VISIBILITIES});
#undef X
    linkage_ = static_cast<std::underlying_type<enum linkage>::type> (l);
    visibility_ = static_cast<std::underlying_type<enum visibility>::type> (v);
}